

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int revnum(int x,int y,int d,char (*board) [8],STATE s,int f)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  long lVar33;
  char (*pacVar34) [8];
  char *pcVar35;
  char cVar36;
  uint uVar37;
  char (*pacVar38) [8];
  uint uVar39;
  char *pcVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  char (*pacVar44) [8];
  char (*pacVar45) [8];
  ulong uVar46;
  long lVar47;
  char (*pacVar48) [8];
  char (*pacVar49) [8];
  uint uVar50;
  uint uVar51;
  char (*pacVar52) [8];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  int iVar77;
  int iVar78;
  undefined1 auVar75 [16];
  int iVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar97;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  char (*local_e8) [8];
  char (*local_e0) [8];
  char (*local_d8) [8];
  char (*local_d0) [8];
  char (*local_c8) [8];
  char (*local_c0) [8];
  char (*local_b8) [8];
  
  auVar31 = _DAT_00103090;
  auVar30 = _DAT_00103080;
  auVar29 = _DAT_00103070;
  auVar28 = _DAT_00103060;
  auVar27 = _DAT_00103050;
  auVar26 = _DAT_00103040;
  auVar25 = _DAT_00103030;
  iVar3 = dir[d][0];
  lVar47 = (long)iVar3;
  iVar74 = dir[d][1];
  uVar37 = iVar3 + x;
  uVar39 = iVar74 + y;
  if (uVar39 < 8 && uVar37 < 8) {
    lVar32 = (long)iVar74;
    uVar50 = x + iVar3 * 2;
    uVar42 = 0xf;
    uVar51 = y + iVar74 * 2;
    do {
      if ((s == WHITE | WHITE) != (int)board[uVar37][uVar39]) {
        if ((int)board[uVar37][uVar39] != s) {
          return 0;
        }
        iVar3 = (int)uVar42 + -0xf;
        if ((int)uVar42 == 0xf || f == 0) {
          return iVar3;
        }
        lVar33 = (long)x;
        lVar43 = (long)y;
        lVar1 = uVar42 - 0x10;
        lVar41 = lVar47 * 0x80 + lVar32 * 0x10;
        local_b8 = board + lVar33 + lVar32 * 2 + lVar47 * 0x10;
        lVar2 = lVar43 + lVar33 * 8;
        local_c0 = board + lVar47 * 0xf;
        local_c8 = board + lVar47 * 0xe;
        local_d0 = board + lVar47 * 0xd;
        local_d8 = board + lVar47 * 0xc;
        local_e0 = board + lVar47 * 0xb;
        local_e8 = board + lVar47 * 5;
        pacVar49 = board + lVar47 * 10;
        pacVar44 = board + lVar47 * 9;
        pacVar45 = board + lVar47 * 8;
        pacVar34 = board + lVar47 * 7;
        pacVar52 = board + lVar47 * 3;
        pacVar38 = board + lVar47 * 6;
        pacVar48 = board + lVar47 * 4;
        pcVar40 = *board + lVar32 * 2;
        pcVar35 = *board + lVar32;
        auVar54._8_4_ = (int)lVar1;
        auVar54._0_8_ = lVar1;
        auVar54._12_4_ = (int)((ulong)lVar1 >> 0x20);
        uVar46 = 0;
        do {
          auVar72._8_4_ = (int)uVar46;
          auVar72._0_8_ = uVar46;
          auVar72._12_4_ = (int)(uVar46 >> 0x20);
          auVar75 = auVar54 ^ auVar31;
          auVar80 = (auVar72 | auVar30) ^ auVar31;
          iVar74 = auVar75._0_4_;
          iVar93 = -(uint)(iVar74 < auVar80._0_4_);
          iVar77 = auVar75._4_4_;
          auVar82._4_4_ = -(uint)(iVar77 < auVar80._4_4_);
          iVar78 = auVar75._8_4_;
          iVar97 = -(uint)(iVar78 < auVar80._8_4_);
          iVar79 = auVar75._12_4_;
          auVar82._12_4_ = -(uint)(iVar79 < auVar80._12_4_);
          auVar55._4_4_ = iVar93;
          auVar55._0_4_ = iVar93;
          auVar55._8_4_ = iVar97;
          auVar55._12_4_ = iVar97;
          auVar55 = pshuflw(in_XMM1,auVar55,0xe8);
          auVar81._4_4_ = -(uint)(auVar80._4_4_ == iVar77);
          auVar81._12_4_ = -(uint)(auVar80._12_4_ == iVar79);
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._12_4_;
          auVar64 = pshuflw(in_XMM2,auVar81,0xe8);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar80 = pshuflw(auVar55,auVar82,0xe8);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar75 = (auVar80 | auVar64 & auVar55) ^ auVar75;
          auVar75 = packssdw(auVar75,auVar75);
          cVar36 = (char)s;
          if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar35[lVar2 + lVar47 * 8] = cVar36;
          }
          auVar64._4_4_ = iVar93;
          auVar64._0_4_ = iVar93;
          auVar64._8_4_ = iVar97;
          auVar64._12_4_ = iVar97;
          auVar82 = auVar81 & auVar64 | auVar82;
          auVar75 = packssdw(auVar82,auVar82);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar80,auVar75 ^ auVar80);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._0_4_ >> 8 & 1) != 0) {
            pcVar40[lVar47 * 0x10 + lVar2] = cVar36;
          }
          auVar75 = (auVar72 | auVar29) ^ auVar31;
          auVar65._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar65._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar65._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar65._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar83._4_4_ = auVar65._0_4_;
          auVar83._0_4_ = auVar65._0_4_;
          auVar83._8_4_ = auVar65._8_4_;
          auVar83._12_4_ = auVar65._8_4_;
          iVar93 = -(uint)(auVar75._4_4_ == iVar77);
          iVar97 = -(uint)(auVar75._12_4_ == iVar79);
          auVar13._4_4_ = iVar93;
          auVar13._0_4_ = iVar93;
          auVar13._8_4_ = iVar97;
          auVar13._12_4_ = iVar97;
          auVar94._4_4_ = auVar65._4_4_;
          auVar94._0_4_ = auVar65._4_4_;
          auVar94._8_4_ = auVar65._12_4_;
          auVar94._12_4_ = auVar65._12_4_;
          auVar75 = auVar13 & auVar83 | auVar94;
          auVar75 = packssdw(auVar75,auVar75);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar4,auVar75 ^ auVar4);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._0_4_ >> 0x10 & 1) != 0) {
            pacVar52[lVar33][lVar32 * 3 + lVar43] = cVar36;
          }
          auVar75 = pshufhw(auVar75,auVar83,0x84);
          auVar14._4_4_ = iVar93;
          auVar14._0_4_ = iVar93;
          auVar14._8_4_ = iVar97;
          auVar14._12_4_ = iVar97;
          auVar80 = pshufhw(auVar65,auVar14,0x84);
          auVar55 = pshufhw(auVar75,auVar94,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar55 | auVar80 & auVar75) ^ auVar56;
          auVar75 = packssdw(auVar56,auVar56);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._0_4_ >> 0x18 & 1) != 0) {
            pacVar48[lVar33][lVar32 * 4 + lVar43] = cVar36;
          }
          auVar75 = (auVar72 | auVar28) ^ auVar31;
          auVar66._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar66._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar66._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar66._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar15._4_4_ = auVar66._0_4_;
          auVar15._0_4_ = auVar66._0_4_;
          auVar15._8_4_ = auVar66._8_4_;
          auVar15._12_4_ = auVar66._8_4_;
          auVar80 = pshuflw(auVar94,auVar15,0xe8);
          auVar57._0_4_ = -(uint)(auVar75._0_4_ == iVar74);
          auVar57._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
          auVar57._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
          auVar57._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
          auVar84._4_4_ = auVar57._4_4_;
          auVar84._0_4_ = auVar57._4_4_;
          auVar84._8_4_ = auVar57._12_4_;
          auVar84._12_4_ = auVar57._12_4_;
          auVar75 = pshuflw(auVar57,auVar84,0xe8);
          auVar85._4_4_ = auVar66._4_4_;
          auVar85._0_4_ = auVar66._4_4_;
          auVar85._8_4_ = auVar66._12_4_;
          auVar85._12_4_ = auVar66._12_4_;
          auVar55 = pshuflw(auVar66,auVar85,0xe8);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 & auVar80,(auVar55 | auVar75 & auVar80) ^ auVar5);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[lVar33][lVar32 * 5 + lVar43] = cVar36;
          }
          auVar16._4_4_ = auVar66._0_4_;
          auVar16._0_4_ = auVar66._0_4_;
          auVar16._8_4_ = auVar66._8_4_;
          auVar16._12_4_ = auVar66._8_4_;
          auVar85 = auVar84 & auVar16 | auVar85;
          auVar55 = packssdw(auVar85,auVar85);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75,auVar55 ^ auVar6);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._4_2_ >> 8 & 1) != 0) {
            pacVar38[lVar33][lVar32 * 6 + lVar43] = cVar36;
          }
          auVar75 = (auVar72 | auVar27) ^ auVar31;
          auVar67._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar67._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar67._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar67._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar86._4_4_ = auVar67._0_4_;
          auVar86._0_4_ = auVar67._0_4_;
          auVar86._8_4_ = auVar67._8_4_;
          auVar86._12_4_ = auVar67._8_4_;
          iVar93 = -(uint)(auVar75._4_4_ == iVar77);
          iVar97 = -(uint)(auVar75._12_4_ == iVar79);
          auVar17._4_4_ = iVar93;
          auVar17._0_4_ = iVar93;
          auVar17._8_4_ = iVar97;
          auVar17._12_4_ = iVar97;
          auVar95._4_4_ = auVar67._4_4_;
          auVar95._0_4_ = auVar67._4_4_;
          auVar95._8_4_ = auVar67._12_4_;
          auVar95._12_4_ = auVar67._12_4_;
          auVar75 = auVar17 & auVar86 | auVar95;
          auVar75 = packssdw(auVar75,auVar75);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar7,auVar75 ^ auVar7);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pacVar34[lVar33][lVar32 * 7 + lVar43] = cVar36;
          }
          auVar75 = pshufhw(auVar75,auVar86,0x84);
          auVar18._4_4_ = iVar93;
          auVar18._0_4_ = iVar93;
          auVar18._8_4_ = iVar97;
          auVar18._12_4_ = iVar97;
          auVar80 = pshufhw(auVar67,auVar18,0x84);
          auVar55 = pshufhw(auVar75,auVar95,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar55 | auVar80 & auVar75) ^ auVar58;
          auVar75 = packssdw(auVar58,auVar58);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._6_2_ >> 8 & 1) != 0) {
            pacVar45[lVar32 + lVar33][lVar43] = cVar36;
          }
          auVar75 = (auVar72 | auVar26) ^ auVar31;
          auVar68._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar68._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar68._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar68._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar19._4_4_ = auVar68._0_4_;
          auVar19._0_4_ = auVar68._0_4_;
          auVar19._8_4_ = auVar68._8_4_;
          auVar19._12_4_ = auVar68._8_4_;
          auVar80 = pshuflw(auVar95,auVar19,0xe8);
          auVar59._0_4_ = -(uint)(auVar75._0_4_ == iVar74);
          auVar59._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
          auVar59._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
          auVar59._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
          auVar87._4_4_ = auVar59._4_4_;
          auVar87._0_4_ = auVar59._4_4_;
          auVar87._8_4_ = auVar59._12_4_;
          auVar87._12_4_ = auVar59._12_4_;
          auVar75 = pshuflw(auVar59,auVar87,0xe8);
          auVar88._4_4_ = auVar68._4_4_;
          auVar88._0_4_ = auVar68._4_4_;
          auVar88._8_4_ = auVar68._12_4_;
          auVar88._12_4_ = auVar68._12_4_;
          auVar55 = pshuflw(auVar68,auVar88,0xe8);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar69 = (auVar55 | auVar75 & auVar80) ^ auVar69;
          auVar55 = packssdw(auVar69,auVar69);
          auVar75 = packsswb(auVar75 & auVar80,auVar55);
          if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)pacVar44 + lVar32 * 9 + lVar2) = cVar36;
          }
          auVar20._4_4_ = auVar68._0_4_;
          auVar20._0_4_ = auVar68._0_4_;
          auVar20._8_4_ = auVar68._8_4_;
          auVar20._12_4_ = auVar68._8_4_;
          auVar88 = auVar87 & auVar20 | auVar88;
          auVar55 = packssdw(auVar88,auVar88);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar55 = packssdw(auVar55 ^ auVar8,auVar55 ^ auVar8);
          auVar75 = packsswb(auVar75,auVar55);
          if ((auVar75._8_2_ >> 8 & 1) != 0) {
            *(char *)((long)pacVar49 + lVar2 + lVar32 * 10) = cVar36;
          }
          auVar75 = (auVar72 | auVar25) ^ auVar31;
          auVar70._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar70._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar70._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar70._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar89._4_4_ = auVar70._0_4_;
          auVar89._0_4_ = auVar70._0_4_;
          auVar89._8_4_ = auVar70._8_4_;
          auVar89._12_4_ = auVar70._8_4_;
          iVar93 = -(uint)(auVar75._4_4_ == iVar77);
          iVar97 = -(uint)(auVar75._12_4_ == iVar79);
          auVar21._4_4_ = iVar93;
          auVar21._0_4_ = iVar93;
          auVar21._8_4_ = iVar97;
          auVar21._12_4_ = iVar97;
          auVar96._4_4_ = auVar70._4_4_;
          auVar96._0_4_ = auVar70._4_4_;
          auVar96._8_4_ = auVar70._12_4_;
          auVar96._12_4_ = auVar70._12_4_;
          auVar75 = auVar21 & auVar89 | auVar96;
          auVar75 = packssdw(auVar75,auVar75);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar9,auVar75 ^ auVar9);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)local_e0 + lVar32 * 0xb + lVar2) = cVar36;
          }
          auVar75 = pshufhw(auVar75,auVar89,0x84);
          auVar22._4_4_ = iVar93;
          auVar22._0_4_ = iVar93;
          auVar22._8_4_ = iVar97;
          auVar22._12_4_ = iVar97;
          auVar80 = pshufhw(auVar70,auVar22,0x84);
          auVar55 = pshufhw(auVar75,auVar96,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar55 | auVar80 & auVar75) ^ auVar60;
          auVar75 = packssdw(auVar60,auVar60);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._10_2_ >> 8 & 1) != 0) {
            *(char *)((long)local_d8 + lVar2 + lVar32 * 0xc) = cVar36;
          }
          auVar75 = (auVar72 | _DAT_00103020) ^ auVar31;
          auVar71._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar71._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar71._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar71._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar23._4_4_ = auVar71._0_4_;
          auVar23._0_4_ = auVar71._0_4_;
          auVar23._8_4_ = auVar71._8_4_;
          auVar23._12_4_ = auVar71._8_4_;
          auVar80 = pshuflw(auVar96,auVar23,0xe8);
          auVar61._0_4_ = -(uint)(auVar75._0_4_ == iVar74);
          auVar61._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
          auVar61._8_4_ = -(uint)(auVar75._8_4_ == iVar78);
          auVar61._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
          auVar90._4_4_ = auVar61._4_4_;
          auVar90._0_4_ = auVar61._4_4_;
          auVar90._8_4_ = auVar61._12_4_;
          auVar90._12_4_ = auVar61._12_4_;
          auVar75 = pshuflw(auVar61,auVar90,0xe8);
          auVar91._4_4_ = auVar71._4_4_;
          auVar91._0_4_ = auVar71._4_4_;
          auVar91._8_4_ = auVar71._12_4_;
          auVar91._12_4_ = auVar71._12_4_;
          auVar55 = pshuflw(auVar71,auVar91,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 & auVar80,(auVar55 | auVar75 & auVar80) ^ auVar10);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)local_d0 + lVar32 * 0xd + lVar2) = cVar36;
          }
          auVar24._4_4_ = auVar71._0_4_;
          auVar24._0_4_ = auVar71._0_4_;
          auVar24._8_4_ = auVar71._8_4_;
          auVar24._12_4_ = auVar71._8_4_;
          auVar91 = auVar90 & auVar24 | auVar91;
          auVar55 = packssdw(auVar91,auVar91);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75,auVar55 ^ auVar11);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75._12_2_ >> 8 & 1) != 0) {
            *(char *)((long)local_c8 + lVar32 * 0xe + lVar2) = cVar36;
          }
          auVar75 = (auVar72 | _DAT_00103010) ^ auVar31;
          auVar62._0_4_ = -(uint)(iVar74 < auVar75._0_4_);
          auVar62._4_4_ = -(uint)(iVar77 < auVar75._4_4_);
          auVar62._8_4_ = -(uint)(iVar78 < auVar75._8_4_);
          auVar62._12_4_ = -(uint)(iVar79 < auVar75._12_4_);
          auVar92._4_4_ = auVar62._0_4_;
          auVar92._0_4_ = auVar62._0_4_;
          auVar92._8_4_ = auVar62._8_4_;
          auVar92._12_4_ = auVar62._8_4_;
          auVar73._4_4_ = -(uint)(auVar75._4_4_ == iVar77);
          auVar73._12_4_ = -(uint)(auVar75._12_4_ == iVar79);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar76._4_4_ = auVar62._4_4_;
          auVar76._0_4_ = auVar62._4_4_;
          auVar76._8_4_ = auVar62._12_4_;
          auVar76._12_4_ = auVar62._12_4_;
          auVar55 = auVar73 & auVar92 | auVar76;
          auVar75 = packssdw(auVar62,auVar55);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar75 = packssdw(auVar75 ^ auVar12,auVar75 ^ auVar12);
          auVar75 = packsswb(auVar75,auVar75);
          if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)local_c0 + lVar32 * 0xf + lVar2) = cVar36;
          }
          auVar75 = pshufhw(auVar75,auVar92,0x84);
          auVar55 = pshufhw(auVar55,auVar73,0x84);
          in_XMM2 = auVar55 & auVar75;
          auVar75 = pshufhw(auVar75,auVar76,0x84);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar75 | in_XMM2) ^ auVar63;
          auVar75 = packssdw(auVar63,auVar63);
          in_XMM1 = packsswb(auVar75,auVar75);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            (*local_b8)[lVar43] = cVar36;
          }
          uVar46 = uVar46 + 0x10;
          local_b8 = local_b8 + lVar32 * 2 + lVar47 * 0x10;
          local_c0 = local_c0 + lVar32 * 2 + lVar47 * 0x10;
          local_c8 = local_c8 + lVar32 * 2 + lVar47 * 0x10;
          local_d0 = local_d0 + lVar32 * 2 + lVar47 * 0x10;
          local_d8 = local_d8 + lVar32 * 2 + lVar47 * 0x10;
          local_e0 = local_e0 + lVar32 * 2 + lVar47 * 0x10;
          pacVar49 = pacVar49 + lVar32 * 2 + lVar47 * 0x10;
          pacVar44 = pacVar44 + lVar32 * 2 + lVar47 * 0x10;
          pacVar45 = pacVar45 + lVar32 * 2 + lVar47 * 0x10;
          pacVar34 = pacVar34 + lVar32 * 2 + lVar47 * 0x10;
          pacVar38 = pacVar38 + lVar32 * 2 + lVar47 * 0x10;
          local_e8 = local_e8 + lVar32 * 2 + lVar47 * 0x10;
          pacVar48 = pacVar48 + lVar32 * 2 + lVar47 * 0x10;
          pacVar52 = pacVar52 + lVar32 * 2 + lVar47 * 0x10;
          pcVar40 = pcVar40 + lVar41;
          pcVar35 = pcVar35 + lVar41;
        } while ((uVar42 & 0xfffffffffffffff0) != uVar46);
        return iVar3;
      }
      if (7 < uVar50) {
        return 0;
      }
      uVar37 = uVar37 + iVar3;
      uVar39 = uVar39 + iVar74;
      uVar42 = uVar42 + 1;
      uVar50 = uVar50 + iVar3;
      bVar53 = uVar51 < 8;
      uVar51 = uVar51 + iVar74;
    } while (bVar53);
  }
  return 0;
}

Assistant:

int revnum(int x, int y, int d, char board[][SIZE], STATE s, int f) {
    int x0 = x, y0 = y;
    int a = dir[d][0], b = dir[d][1];
    int num = 0, flag = 0;
    STATE rs = (s == WHITE ? BLACK : WHITE);
    x += a;
    y += b;
    while (x >= 0 && x < SIZE && y >= 0 && y < SIZE) {
        if (board[x][y] == rs) {
            num++;
        } else if (board[x][y] == s) {
            flag = 1;
            break;
        } else {
            break;
        }
        x += a;
        y += b;
    }
    if (flag) {
        if (f) {
            int k;
            for (k = 1; k <= num; k++) {
                x = x0 + a * k;
                y = y0 + b * k;
                board[x][y] = s;
            }
        }
        return num;
    }
    return 0;
}